

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::RandomWordTestData
          (RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this,
          char16_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> local_38;
  const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *pRStack_10;
  char16_t in_delim_local;
  RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._6_2_ = in_delim;
  pRStack_10 = this;
  std::vector<char16_t,_std::allocator<char16_t>_>::vector(&this->m_delim);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::vector<char16_t,_std::allocator<char16_t>_>::vector(&this->m_str);
  std::
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  ::vector(&this->m_tokens);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_token_indexes);
  local_38._M_current =
       (char16_t *)std::vector<char16_t,_std::allocator<char16_t>_>::end(&this->m_delim);
  __gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>::
  __normal_iterator<char16_t*>
            ((__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>> *)
             &local_30,&local_38);
  std::vector<char16_t,_std::allocator<char16_t>_>::insert
            (&this->m_delim,local_30,(value_type_conflict1 *)((long)&in_fixed_word_count_local + 6))
  ;
  populate(this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}